

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ostream.h
# Opt level: O3

WifiDebugOstream * operator<<(WifiDebugOstream *sink,uint i)

{
  if (9 < i) {
    operator<<(sink,i / 10);
  }
  WifiDebugOstream::onechar(sink,(char)i + (char)(i / 10) * -10 | 0x30);
  return sink;
}

Assistant:

T& operator<<( T& sink, unsigned int i )
{
  // Handle digits that aren't the lowest digit (if any)
  if ( i >= 10 )
  {
    sink << i/10;
  }

  // Handle the lowest digit
  char c = '0' + (i % 10);
  sink.write( &c, 1 );

  return sink;
}